

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O3

void __thiscall
trackerboy::apu::Hardware::run(Hardware *this,Mixer *mixer,uint32_t cycletime,uint32_t cycles)

{
  uint cycles_00;
  
  if (cycles != 0) {
    do {
      cycles_00 = (this->mSequencer).mTimer.mCounter;
      if (cycles <= cycles_00) {
        cycles_00 = cycles;
      }
      runChannel<trackerboy::apu::PulseChannel>
                (this,0,&(this->mChannels).
                         super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                         .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl,
                 mixer,cycletime,cycles_00);
      runChannel<trackerboy::apu::PulseChannel>
                (this,1,&(this->mChannels).
                         super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                         .
                         super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                         .super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl,
                 mixer,cycletime,cycles_00);
      runChannel<trackerboy::apu::WaveChannel>
                (this,2,&(this->mChannels).
                         super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                         .
                         super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                         .
                         super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                         .super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl,
                 mixer,cycletime,cycles_00);
      runChannel<trackerboy::apu::NoiseChannel>
                (this,3,(NoiseChannel *)&this->mChannels,mixer,cycletime,cycles_00);
      Sequencer::run(&this->mSequencer,this,cycles_00);
      cycletime = cycletime + cycles_00;
      cycles = cycles - cycles_00;
    } while (cycles != 0);
  }
  return;
}

Assistant:

void Hardware::run(Mixer &mixer, uint32_t cycletime, uint32_t cycles) noexcept {
    while (cycles) {
        // step components to the beat of the sequencer
        auto toStep = std::min(cycles, mSequencer.cyclesToNextTrigger());
        runChannel(0, std::get<0>(mChannels), mixer, cycletime, toStep);
        runChannel(1, std::get<1>(mChannels), mixer, cycletime, toStep);
        runChannel(2, std::get<2>(mChannels), mixer, cycletime, toStep);
        runChannel(3, std::get<3>(mChannels), mixer, cycletime, toStep);
        mSequencer.run(*this, toStep);

        cycletime += toStep;
        cycles -= toStep;
    }
}